

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::ScalarSwizzlersInvalidTest::prepareNextTestCase
          (ScalarSwizzlersInvalidTest *this,GLuint test_case_index)

{
  bool bVar1;
  GLuint test_case_index_local;
  ScalarSwizzlersInvalidTest *this_local;
  
  bVar1 = test_case_index + 1 < 8;
  if (bVar1) {
    this->m_case = test_case_index;
  }
  return bVar1;
}

Assistant:

bool ScalarSwizzlersInvalidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case INVALID_Y:
	case INVALID_B:
	case INVALID_Q:
	case INVALID_XY:
	case INVALID_XRS:
	case WRONG:
	case MISSING_PARENTHESIS:
		m_case = (TESTED_CASES)test_case_index;
		break;
	default:
		return false;
	}

	return true;
}